

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O2

void do_cmd_wizard(void)

{
  ulong uVar1;
  player_upkeep *ppVar2;
  _Bool _Var3;
  player *ppVar4;
  char *fmt;
  
  ppVar4 = player;
  if ((player->noscore & 2) == 0) {
    msg("You are about to enter \'wizard\' mode for the very first time!");
    msg("This is a form of cheating, and your game will not be scored!");
    event_signal(EVENT_MESSAGE_FLUSH);
    _Var3 = get_check("Are you sure you want to enter wizard mode? ");
    ppVar4 = player;
    if (!_Var3) {
      return;
    }
    player->noscore = player->noscore | 2;
  }
  fmt = "Wizard mode on.";
  if (ppVar4->wizard != false) {
    fmt = "Wizard mode off.";
  }
  ppVar4->wizard = (_Bool)(ppVar4->wizard ^ 1);
  msg(fmt);
  ppVar2 = player->upkeep;
  uVar1._0_4_ = ppVar2->update;
  uVar1._4_4_ = ppVar2->redraw;
  ppVar2->update = (int)(uVar1 | 0x200000080);
  ppVar2->redraw = (int)((uVar1 | 0x200000080) >> 0x20);
  return;
}

Assistant:

void do_cmd_wizard(void)
{
	/* Verify first time */
	if (!(player->noscore & NOSCORE_WIZARD)) {
		/* Mention effects */
		msg("You are about to enter 'wizard' mode for the very first time!");
		msg("This is a form of cheating, and your game will not be scored!");
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Verify request */
		if (!get_check("Are you sure you want to enter wizard mode? "))
			return;

		/* Mark savefile */
		player->noscore |= NOSCORE_WIZARD;
	}

	/* Toggle mode */
	if (player->wizard) {
		player->wizard = false;
		msg("Wizard mode off.");
	} else {
		player->wizard = true;
		msg("Wizard mode on.");
	}

	/* Update monsters */
	player->upkeep->update |= (PU_MONSTERS);

	/* Redraw "title" */
	player->upkeep->redraw |= (PR_TITLE);
}